

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int is_fpmt_config(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  AV1EncoderConfig *oxcf_local;
  AV1_PRIMARY *ppi_local;
  int local_4;
  
  if (((oxcf->rc_cfg).mode == AOM_CBR) || ((oxcf->rc_cfg).mode == AOM_CQ)) {
    local_4 = 0;
  }
  else if (ppi->use_svc == 0) {
    if (((oxcf->tile_cfg).enable_large_scale_tile & 1U) == 0) {
      if (((oxcf->dec_model_cfg).timing_info_present & 1U) == 0) {
        if (oxcf->mode == '\0') {
          if (((oxcf->tool_cfg).error_resilient_mode & 1U) == 0) {
            if ((oxcf->resize_cfg).resize_mode == '\0') {
              if (oxcf->pass == AOM_RC_LAST_PASS) {
                if (oxcf->max_threads < 2) {
                  local_4 = 0;
                }
                else if ((oxcf->fp_mt & 1U) == 0) {
                  local_4 = 0;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int is_fpmt_config(const AV1_PRIMARY *ppi,
                                 const AV1EncoderConfig *oxcf) {
  // FPMT is enabled for AOM_Q and AOM_VBR.
  // TODO(Tarun): Test and enable resize config.
  if (oxcf->rc_cfg.mode == AOM_CBR || oxcf->rc_cfg.mode == AOM_CQ) {
    return 0;
  }
  if (ppi->use_svc) {
    return 0;
  }
  if (oxcf->tile_cfg.enable_large_scale_tile) {
    return 0;
  }
  if (oxcf->dec_model_cfg.timing_info_present) {
    return 0;
  }
  if (oxcf->mode != GOOD) {
    return 0;
  }
  if (oxcf->tool_cfg.error_resilient_mode) {
    return 0;
  }
  if (oxcf->resize_cfg.resize_mode) {
    return 0;
  }
  if (oxcf->pass != AOM_RC_SECOND_PASS) {
    return 0;
  }
  if (oxcf->max_threads < 2) {
    return 0;
  }
  if (!oxcf->fp_mt) {
    return 0;
  }

  return 1;
}